

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O1

void tinyformat::detail::formatImpl(ostream *out,char *fmt,FormatArg *args,int numArgs)

{
  ostream *poVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ostream oVar5;
  ostream oVar6;
  long lVar7;
  runtime_error *prVar8;
  size_type sVar9;
  char *fmtStart;
  long in_FS_OFFSET;
  int ntrunc;
  bool spacePadPositive;
  int argIndex;
  bool positionalMode;
  string result;
  ostringstream tmpStream;
  undefined1 local_1a0 [8];
  uint auStack_198 [22];
  ios_base local_140 [264];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar7 = *(long *)(*(long *)out + -0x18);
  poVar1 = out + lVar7;
  uVar3 = *(undefined8 *)(out + lVar7 + 8);
  uVar4 = *(undefined8 *)(out + lVar7 + 0x10);
  uVar2 = *(undefined4 *)(out + lVar7 + 0x18);
  if (out[lVar7 + 0xe1] == (ostream)0x0) {
    oVar5 = (ostream)std::ios::widen((char)poVar1);
    poVar1[0xe0] = oVar5;
    poVar1[0xe1] = (ostream)0x1;
  }
  oVar5 = poVar1[0xe0];
  positionalMode = false;
  argIndex = 0;
  fmtStart = fmt;
  do {
    for (; *fmtStart == '%'; fmtStart = fmtStart + 1) {
      std::ostream::write((char *)out,(long)fmt);
      if (fmtStart[1] != '%') goto LAB_00124542;
      fmt = fmtStart + 1;
      fmtStart = fmt;
LAB_0012453d:
    }
    if (*fmtStart != '\0') goto LAB_0012453d;
    std::ostream::write((char *)out,(long)fmt);
LAB_00124542:
    if (*fmtStart == '\0') {
      if ((positionalMode == false) && (argIndex < numArgs)) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        _tmpStream = local_1a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&tmpStream,
                   "tinyformat: Not enough conversion specifiers in format string","");
        std::runtime_error::runtime_error(prVar8,(string *)&tmpStream);
        *(undefined ***)prVar8 = &PTR__runtime_error_001e0688;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar8,&format_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        lVar7 = *(long *)out;
        *(undefined8 *)(out + *(long *)(lVar7 + -0x18) + 0x10) = uVar4;
        *(undefined8 *)(out + *(long *)(lVar7 + -0x18) + 8) = uVar3;
        *(undefined4 *)(out + *(long *)(lVar7 + -0x18) + 0x18) = uVar2;
        poVar1 = out + *(long *)(lVar7 + -0x18);
        if (out[*(long *)(lVar7 + -0x18) + 0xe1] == (ostream)0x0) {
          oVar6 = (ostream)std::ios::widen((char)poVar1);
          poVar1[0xe0] = oVar6;
          poVar1[0xe1] = (ostream)0x1;
        }
        poVar1[0xe0] = oVar5;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return;
        }
      }
      goto LAB_0012491d;
    }
    spacePadPositive = false;
    ntrunc = -1;
    fmt = streamStateFromFormat
                    (out,&positionalMode,&spacePadPositive,&ntrunc,fmtStart,args,&argIndex,numArgs);
    lVar7 = (long)argIndex;
    if (numArgs <= argIndex) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      _tmpStream = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&tmpStream,"tinyformat: Too many conversion specifiers in format string",
                 "");
      std::runtime_error::runtime_error(prVar8,(string *)&tmpStream);
      *(undefined ***)prVar8 = &PTR__runtime_error_001e0688;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar8,&format_error::typeinfo,std::runtime_error::~runtime_error);
      }
LAB_0012491d:
      __stack_chk_fail();
    }
    if (spacePadPositive == false) {
      FormatArg::format(args + lVar7,out,fmtStart,fmt,ntrunc);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmpStream);
      std::ios::copyfmt((ios *)((ostringstream *)&tmpStream + *(long *)(_tmpStream + -0x18)));
      *(uint *)((long)auStack_198 + *(long *)(_tmpStream + -0x18)) =
           *(uint *)((long)auStack_198 + *(long *)(_tmpStream + -0x18)) | 0x800;
      FormatArg::format(args + lVar7,(ostream *)&tmpStream,fmtStart,fmt,ntrunc);
      std::__cxx11::stringbuf::str();
      if (result._M_string_length != 0) {
        sVar9 = 0;
        do {
          if (result._M_dataplus._M_p[sVar9] == '+') {
            result._M_dataplus._M_p[sVar9] = ' ';
          }
          sVar9 = sVar9 + 1;
        } while (result._M_string_length != sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (out,result._M_dataplus._M_p,result._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)result._M_dataplus._M_p != &result.field_2) {
        operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmpStream);
      std::ios_base::~ios_base(local_140);
    }
    fmtStart = fmt;
    if (positionalMode == false) {
      argIndex = argIndex + 1;
    }
  } while( true );
}

Assistant:

inline void formatImpl(std::ostream& out, const char* fmt,
                       const detail::FormatArg* args,
                       int numArgs)
{
    // Saved stream state
    std::streamsize origWidth = out.width();
    std::streamsize origPrecision = out.precision();
    std::ios::fmtflags origFlags = out.flags();
    char origFill = out.fill();

    // "Positional mode" means all format specs should be of the form "%n$..."
    // with `n` an integer. We detect this in `streamStateFromFormat`.
    bool positionalMode = false;
    int argIndex = 0;
    while (true) {
        fmt = printFormatStringLiteral(out, fmt);
        if (*fmt == '\0') {
            if (!positionalMode && argIndex < numArgs) {
                TINYFORMAT_ERROR("tinyformat: Not enough conversion specifiers in format string");
            }
            break;
        }
        bool spacePadPositive = false;
        int ntrunc = -1;
        const char* fmtEnd = streamStateFromFormat(out, positionalMode, spacePadPositive, ntrunc, fmt,
                                                   args, argIndex, numArgs);
        // NB: argIndex may be incremented by reading variable width/precision
        // in `streamStateFromFormat`, so do the bounds check here.
        if (argIndex >= numArgs) {
            TINYFORMAT_ERROR("tinyformat: Too many conversion specifiers in format string");
            return;
        }
        const FormatArg& arg = args[argIndex];
        // Format the arg into the stream.
        if (!spacePadPositive) {
            arg.format(out, fmt, fmtEnd, ntrunc);
        }
        else {
            // The following is a special case with no direct correspondence
            // between stream formatting and the printf() behaviour.  Simulate
            // it crudely by formatting into a temporary string stream and
            // munging the resulting string.
            std::ostringstream tmpStream;
            tmpStream.copyfmt(out);
            tmpStream.setf(std::ios::showpos);
            arg.format(tmpStream, fmt, fmtEnd, ntrunc);
            std::string result = tmpStream.str(); // allocates... yuck.
            for (size_t i = 0, iend = result.size(); i < iend; ++i) {
                if (result[i] == '+')
                    result[i] = ' ';
            }
            out << result;
        }
        if (!positionalMode)
            ++argIndex;
        fmt = fmtEnd;
    }

    // Restore stream state
    out.width(origWidth);
    out.precision(origPrecision);
    out.flags(origFlags);
    out.fill(origFill);
}